

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O3

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  uint8_t uVar1;
  cs_detail *pcVar2;
  cs_insn *pcVar3;
  csh cVar4;
  byte bVar5;
  uint16_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  x86_reg xVar11;
  ulong uVar12;
  undefined *puVar13;
  OperandSpecifier *pOVar14;
  ulong uVar15;
  DisassemblerMode mode;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  InternalInstruction insn;
  uint8_t *local_1a0;
  size_t local_198;
  uint64_t local_190;
  csh local_188;
  InternalInstruction local_180;
  
  local_188 = ud;
  memset(&local_180,0,0x150);
  pcVar2 = instr->flat_insn->detail;
  local_1a0 = code;
  local_198 = code_len;
  local_190 = address;
  if (pcVar2 != (cs_detail *)0x0) {
    memset(pcVar2,0,0x228);
  }
  cVar4 = local_188;
  mode = ((*(uint *)(local_188 + 4) & 4) == 0) + MODE_32BIT;
  if ((*(uint *)(local_188 + 4) & 2) != 0) {
    mode = MODE_16BIT;
  }
  iVar7 = decodeInstruction(&local_180,reader,&local_1a0,address,mode);
  if (iVar7 != 0) {
    uVar6 = (uint16_t)(local_180.readerCursor - address);
    *size = uVar6;
    if (uVar6 == 4) {
      if (*(int *)(cVar4 + 4) != 2) {
        uVar17 = address - local_190;
        if (uVar17 < local_198) {
          bVar18 = local_1a0[uVar17] == 0xf3;
        }
        else {
          bVar18 = false;
        }
        if (uVar17 + 1 < local_198) {
          bVar19 = local_1a0[uVar17 + 1] == '\x0f';
        }
        else {
          bVar19 = false;
        }
        if (uVar17 + 2 < local_198) {
          bVar20 = local_1a0[uVar17 + 2] == '\x1e';
        }
        else {
          bVar20 = false;
        }
        if (uVar17 + 3 < local_198) {
          bVar20 = (bool)(bVar18 & bVar19 & bVar20);
          if ((bVar20) && (local_1a0[uVar17 + 3] == 0xfa)) {
            instr->Opcode = 0x2297;
            instr->OpcodePub = 0x5dc;
            builtin_strncpy(instr->assembly,"endbr64",8);
            pcVar2 = instr->flat_insn->detail;
            if (pcVar2 == (cs_detail *)0x0) {
              return true;
            }
            (pcVar2->field_6).x86.opcode[0] = 0xf3;
            (instr->flat_insn->detail->field_6).x86.opcode[1] = '\x0f';
            (instr->flat_insn->detail->field_6).x86.opcode[2] = '\x1e';
            (instr->flat_insn->detail->field_6).x86.opcode[3] = 0xfa;
            return true;
          }
          if ((bool)(bVar20 & local_1a0[uVar17 + 3] == 0xfb)) {
            instr->Opcode = 0x2296;
            instr->OpcodePub = 0x5db;
            builtin_strncpy(instr->assembly,"endbr32",8);
            pcVar2 = instr->flat_insn->detail;
            if (pcVar2 == (cs_detail *)0x0) {
              return true;
            }
            (pcVar2->field_6).x86.opcode[0] = 0xf3;
            (instr->flat_insn->detail->field_6).x86.opcode[1] = '\x0f';
            (instr->flat_insn->detail->field_6).x86.opcode[2] = '\x1e';
            (instr->flat_insn->detail->field_6).x86.opcode[3] = 0xfb;
            return true;
          }
        }
      }
    }
    else if (((uint)(local_180.readerCursor - address) & 0xffff) == 2) {
      uVar17 = address - local_190;
      bVar18 = true;
      if (uVar17 < local_198) {
        bVar18 = local_1a0[uVar17] != '\x0f';
      }
      if ((uVar17 + 1 < local_198) && (!bVar18 && local_1a0[uVar17 + 1] == 0xff)) {
        instr->Opcode = 0x2295;
        instr->OpcodePub = 0x5da;
        builtin_strncpy(instr->assembly,"ud0",4);
        pcVar2 = instr->flat_insn->detail;
        if (pcVar2 == (cs_detail *)0x0) {
          return true;
        }
        (pcVar2->field_6).x86.opcode[0] = '\x0f';
        (instr->flat_insn->detail->field_6).x86.opcode[1] = 0xff;
        return true;
      }
    }
    goto switchD_002391c7_caseD_b;
  }
  *size = (uint16_t)local_180.length;
  if (local_180.spec == (InstructionSpecifier *)0x0) goto switchD_002391c7_caseD_b;
  MCInst_setOpcode(instr,(uint)local_180.instructionID);
  if (local_180.xAcquireRelease == true) {
    uVar8 = MCInst_getOpcode(instr);
    uVar9 = 0x2281;
    if (uVar8 != 0x980) {
      uVar8 = MCInst_getOpcode(instr);
      uVar9 = 0x2238;
      if (uVar8 != 0x978) goto LAB_00239178;
    }
    MCInst_setOpcode(instr,uVar9);
  }
LAB_00239178:
  local_180.numImmediatesTranslated = 0;
  lVar16 = 0;
  do {
    uVar1 = local_180.operands[lVar16].encoding;
    if (uVar1 != '\0') {
      pOVar14 = local_180.operands + lVar16;
LAB_002391b0:
      switch(uVar1) {
      case '\x01':
        uVar17 = (ulong)local_180.reg;
LAB_0023929f:
        uVar8 = (uint)(byte)(&translateRegister_llvmRegnums)[uVar17];
LAB_002399a6:
        MCOperand_CreateReg0(instr,uVar8);
        break;
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
      case '\x06':
      case '\a':
      case '\b':
        switch(pOVar14->type) {
        case '\b':
        case '\t':
        case '\n':
        case '\v':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
        case ':':
        case ';':
        case '>':
        case '?':
        case 'D':
        case 'E':
        case 'G':
          if (local_180.eaBase == EA_BASE_sib) {
            return false;
          }
          if (local_180.eaBase == EA_BASE_sib64) {
            return false;
          }
          if (0xda < local_180.eaBase - EA_REG_AL) goto switchD_002391c7_caseD_b;
          uVar8 = *(uint *)(&DAT_00414ee8 + (ulong)(local_180.eaBase - EA_REG_AL) * 4);
          goto LAB_002399a6;
        default:
          goto switchD_002391f5_caseD_c;
        case '\x18':
        case '\x19':
        case '\x1a':
        case '\x1b':
        case '\x1c':
        case '\x1d':
        case '\x1e':
        case '\x1f':
        case ' ':
        case '!':
        case '\"':
        case '0':
        case '1':
        case '2':
        case 'F':
        case 'O':
          goto code_r0x002392ba;
        }
      case '\t':
        uVar17 = (ulong)local_180.vvvv;
        goto LAB_0023929f;
      case '\n':
        if ((local_180.writemask & (MODRM_REG_DR6|MODRM_REG_RSP)) != MODRM_REG_AL)
        goto switchD_002391c7_caseD_b;
        uVar8 = local_180.writemask + MODRM_REG_XMM14 & 0x7f;
        goto LAB_002399a6;
      default:
        goto switchD_002391c7_caseD_b;
      case '\x11':
      case '\x12':
      case '\x13':
      case '\x14':
      case '\x1a':
      case '\x1b':
        uVar17 = (ulong)local_180.numImmediatesTranslated;
        local_180.numImmediatesTranslated = local_180.numImmediatesTranslated + 1;
        uVar17 = local_180.immediates[uVar17];
        bVar5 = pOVar14->type;
        uVar8 = (uint)uVar17;
        switch(bVar5) {
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
switchD_0023926b_caseD_c:
          if (uVar1 == '\x13') {
            uVar12 = uVar17 | 0xffffffff00000000;
            bVar18 = (int)uVar8 < 0;
          }
          else if (uVar1 == '\x12') {
            uVar12 = uVar17 | 0xffffffffffff0000;
            bVar18 = (short)uVar17 < 0;
          }
          else {
            if (uVar1 != '\x11') goto LAB_002394e7;
            uVar12 = uVar17 | 0xffffffffffffff00;
            bVar18 = (char)uVar17 < '\0';
          }
          if (bVar18) {
            uVar17 = uVar12;
          }
          goto LAB_002394e7;
        case 0x10:
          if (7 < uVar17) {
            uVar8 = MCInst_getOpcode(instr);
            switch(uVar8) {
            case 0x19f5:
              uVar8 = 0x19f6;
              break;
            case 0x19f6:
            case 0x19f8:
            case 0x19fa:
            case 0x19fc:
            case 0x19fe:
            case 0x1a00:
            case 0x1a02:
            case 0x1a04:
            case 0x1a06:
            case 0x1a08:
            case 0x1a0a:
              goto switchD_00239626_caseD_19f6;
            case 0x19f7:
              uVar8 = 0x19f8;
              break;
            case 0x19f9:
              uVar8 = 0x19fa;
              break;
            case 0x19fb:
              uVar8 = 0x19fc;
              break;
            case 0x19fd:
              uVar8 = 0x19fe;
              break;
            case 0x19ff:
              uVar8 = 0x1a00;
              break;
            case 0x1a01:
              uVar8 = 0x1a02;
              break;
            case 0x1a03:
              uVar8 = 0x1a04;
              break;
            case 0x1a05:
              uVar8 = 0x1a06;
              break;
            case 0x1a07:
              uVar8 = 0x1a08;
              break;
            case 0x1a09:
              uVar8 = 0x1a0a;
              break;
            case 0x1a0b:
              uVar8 = 0x1a0c;
              break;
            default:
              switch(uVar8) {
              case 0x230:
                uVar8 = 0x231;
                break;
              case 0x231:
              case 0x233:
              case 0x235:
              case 0x237:
              case 0x238:
              case 0x23a:
              case 0x23c:
              case 0x23d:
              case 0x23e:
              case 0x240:
                goto switchD_00239626_caseD_19f6;
              case 0x232:
                uVar8 = 0x233;
                break;
              case 0x234:
                uVar8 = 0x235;
                break;
              case 0x236:
                uVar8 = 0x237;
                break;
              case 0x239:
                uVar8 = 0x23a;
                break;
              case 0x23b:
                uVar8 = 0x23c;
                break;
              case 0x23f:
                uVar8 = 0x240;
                break;
              case 0x241:
                uVar8 = 0x242;
                break;
              default:
                switch(uVar8) {
                case 0x19db:
                  uVar8 = 0x19dc;
                  break;
                default:
                  goto switchD_00239626_caseD_19f6;
                case 0x19dd:
                  uVar8 = 0x19de;
                  break;
                case 0x19df:
                  uVar8 = 0x19e0;
                  break;
                case 0x19e1:
                  uVar8 = 0x19e2;
                }
              }
            }
LAB_002395ea:
            MCInst_setOpcode(instr,uVar8);
          }
          break;
        case 0x11:
          if (0x1f < uVar17) {
            uVar9 = MCInst_getOpcode(instr);
            uVar9 = uVar9 - 0xcc5;
            if ((uVar9 < 0x2b) && ((0x55555555555U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) {
              puVar13 = &DAT_004154d8;
LAB_002395e7:
              uVar8 = *(uint *)(puVar13 + (ulong)uVar9 * 4);
              goto LAB_002395ea;
            }
          }
          break;
        case 0x12:
          if (7 < uVar17 || (~uVar8 & 3) == 0) {
            uVar8 = MCInst_getOpcode(instr);
            uVar9 = (uVar8 - 0x1843 >> 1 | (uint)((uVar8 - 0x1843 & 1) != 0) << 0x1f) - 1;
            uVar8 = 0x1844;
            if (uVar9 < 0xcb) {
              puVar13 = &DAT_00415584;
              goto LAB_002395e7;
            }
            goto LAB_002395ea;
          }
          break;
        default:
          if (bVar5 == 0x48) goto switchD_0023926b_caseD_c;
          if (bVar5 == 0x49) {
            if (local_180.displacementSize == '\x04') {
              uVar12 = uVar17 | 0xffffffff00000000;
              bVar18 = (int)uVar8 < 0;
            }
            else if (local_180.displacementSize == '\x02') {
              uVar12 = uVar17 | 0xffffffffffff0000;
              bVar18 = (short)uVar17 < 0;
            }
            else {
              if (local_180.displacementSize != '\x01') break;
              uVar12 = uVar17 | 0xffffffffffffff00;
              bVar18 = (char)uVar17 < '\0';
            }
            if (bVar18) {
              uVar17 = uVar12;
            }
            break;
          }
LAB_002394e7:
          uVar8 = (uint)uVar17;
          if (bVar5 < 0x36) {
            if (bVar5 - 3 < 2) {
              uVar9 = 0x80000000;
              uVar12 = 0xffffffff00000000;
            }
            else {
              if (bVar5 != 1) goto LAB_0023962f;
              uVar12 = 0xffffffffffffff00;
              uVar9 = 0x80;
            }
            uVar15 = 0;
            if ((uVar9 & uVar8) != 0) {
              uVar15 = uVar12;
            }
            uVar17 = uVar15 | uVar17;
            goto LAB_002396b7;
          }
          if (bVar5 - 0x36 < 3) {
            uVar8 = (uVar8 >> 4) + 0x7a;
            goto LAB_002399a6;
          }
          if (bVar5 == 0x39) {
            uVar8 = (uVar8 >> 4) + 0x9a;
            goto LAB_002399a6;
          }
          if (bVar5 == 0x3a) {
            uVar8 = (uVar8 >> 4) + 0xba;
            goto LAB_002399a6;
          }
LAB_0023962f:
          MCOperand_CreateImm0(instr,uVar17);
          if ((byte)(bVar5 - 0x2b) < 4) goto LAB_00239991;
          goto LAB_002399ab;
        }
switchD_00239626_caseD_19f6:
LAB_002396b7:
        MCOperand_CreateImm0(instr,uVar17);
        break;
      case '\x15':
      case '\x16':
      case '\x17':
      case '\x18':
      case '\x1c':
        uVar17 = (ulong)local_180.opcodeRegister;
        goto LAB_0023929f;
      case '\x19':
        uVar8 = (local_180.modRM & 7) + 0x72;
        goto LAB_002399a6;
      case '\x1d':
        goto switchD_002391c7_caseD_1d;
      case '\x1e':
        bVar5 = local_180.isPrefix67;
        if (local_180.mode == MODE_32BIT) {
LAB_00239665:
          uVar8 = (uint)bVar5 * 0x10 + 0x1d;
        }
        else {
          if (local_180.mode != MODE_64BIT) {
            bVar5 = local_180.isPrefix67 ^ 1;
            goto LAB_00239665;
          }
          uVar8 = 0x2b;
          if (local_180.isPrefix67 != false) {
            uVar8 = 0x1d;
          }
        }
        MCOperand_CreateReg0(instr,uVar8);
        goto LAB_00239991;
      case '\x1f':
        if (local_180.mode == MODE_32BIT) {
          bVar5 = local_180.isPrefix67 ^ 1;
        }
        else {
          bVar5 = local_180.isPrefix67;
          if (local_180.mode == MODE_64BIT) {
            uVar8 = (uint)(local_180.isPrefix67 ^ 1) * 0x10 + 0x17;
            goto LAB_002399a6;
          }
        }
        uVar8 = (uint)bVar5 + (uint)bVar5 * 8 + 0xe;
        goto LAB_002399a6;
      }
    }
LAB_002399ab:
    lVar16 = lVar16 + 1;
  } while (lVar16 != 6);
  if ((((*(byte *)(local_188 + 4) & 8) == 0) || (uVar8 = instr->Opcode - 0x4c3, 0x1b < uVar8)) ||
     ((0xc000003U >> (uVar8 & 0x1f) & 1) == 0)) {
    instr->imm_size = local_180.immSize;
    if (*(int *)(local_188 + 0x60) == 0) {
      instr->x86_prefix[0] = local_180.prefix0;
      instr->x86_prefix[1] = local_180.prefix1;
      instr->x86_prefix[2] = local_180.prefix2;
      instr->x86_prefix[3] = local_180.prefix3;
      return true;
    }
    pcVar3 = instr->flat_insn;
    instr->x86_prefix[0] = local_180.prefix0;
    instr->x86_prefix[1] = local_180.prefix1;
    instr->x86_prefix[2] = local_180.prefix2;
    instr->x86_prefix[3] = local_180.prefix3;
    if (local_180.vectorExtensionType == TYPE_NO_VEX_XOP) {
      if (local_180.twoByteEscape == '\0') {
        (pcVar3->detail->field_6).x86.opcode[0] = local_180.opcode;
      }
      else {
        (pcVar3->detail->field_6).x86.opcode[0] = local_180.twoByteEscape;
        if (local_180.threeByteEscape == '\0') {
          (pcVar3->detail->field_6).x86.opcode[1] = local_180.opcode;
        }
        else {
          (pcVar3->detail->field_6).x86.opcode[1] = local_180.threeByteEscape;
          (pcVar3->detail->field_6).x86.opcode[2] = local_180.opcode;
        }
      }
    }
    else {
      (pcVar3->detail->field_6).arm.vector_size = (int)local_180.vectorExtensionPrefix;
    }
    (pcVar3->detail->field_6).x86.rex = local_180.rexPrefix;
    (pcVar3->detail->field_6).x86.addr_size = local_180.addressSize;
    (pcVar3->detail->field_6).x86.modrm = local_180.orgModRM;
    (pcVar3->detail->field_6).x86.encoding.modrm_offset = local_180.modRMOffset;
    (pcVar3->detail->field_6).x86.sib = local_180.sib;
    xVar11 = x86_map_sib_index(local_180.sibIndex);
    (pcVar3->detail->field_6).x86.sib_index = xVar11;
    (pcVar3->detail->field_6).x86.sib_scale = local_180.sibScale;
    xVar11 = x86_map_sib_base(local_180.sibBase);
    (pcVar3->detail->field_6).x86.sib_base = xVar11;
    (pcVar3->detail->field_6).x86.disp = local_180.displacement;
    if (local_180.consumedDisplacement == true) {
      (pcVar3->detail->field_6).x86.encoding.disp_offset = local_180.displacementOffset;
      (pcVar3->detail->field_6).x86.encoding.disp_size = local_180.displacementSize;
    }
    (pcVar3->detail->field_6).x86.encoding.imm_offset = local_180.immediateOffset;
    if (local_180.immediateOffset == '\0' || (pcVar3->detail->field_6).x86.encoding.imm_size != '\0'
       ) {
      return true;
    }
    (pcVar3->detail->field_6).x86.encoding.imm_size = local_180.immediateSize;
    return true;
  }
switchD_002391c7_caseD_b:
switchD_002391f5_caseD_c:
  return false;
switchD_002391c7_caseD_1d:
  pOVar14 = local_180.operands + ((ulong)pOVar14->type - 0x4a);
  uVar1 = pOVar14->encoding;
  goto LAB_002391b0;
code_r0x002392ba:
  switch(local_180.eaBase) {
  case EA_BASE_NONE:
    if (local_180.eaDisplacement != EA_DISP_NONE) {
      if (local_180.mode == MODE_64BIT) {
        if (local_180.prefix3 == 'g') {
          uVar8 = 0x1a;
        }
        else {
          uVar8 = 0x29;
        }
        break;
      }
      uVar8 = 0;
      MCOperand_CreateReg0(instr,0);
      uVar17 = 1;
      goto LAB_0023996f;
    }
    goto switchD_002391c7_caseD_b;
  case EA_BASE_BX_SI:
    uVar8 = 8;
    goto LAB_00239867;
  case EA_BASE_BX_DI:
    uVar8 = 8;
    goto LAB_002397e6;
  case EA_BASE_BP_SI:
    uVar8 = 6;
LAB_00239867:
    MCOperand_CreateReg0(instr,uVar8);
    uVar17 = 1;
    uVar8 = 0x2d;
    goto LAB_0023996f;
  case EA_BASE_BP_DI:
    uVar8 = 6;
LAB_002397e6:
    MCOperand_CreateReg0(instr,uVar8);
    uVar17 = 1;
    uVar8 = 0xe;
    goto LAB_0023996f;
  case EA_BASE_SI:
    uVar8 = 0x2d;
    break;
  case EA_BASE_DI:
    uVar8 = 0xe;
    break;
  case EA_BASE_BP:
    uVar8 = 6;
    break;
  case EA_BASE_BX:
    uVar8 = 8;
    break;
  case EA_BASE_R8W:
    uVar8 = 0xea;
    break;
  case EA_BASE_R9W:
    uVar8 = 0xeb;
    break;
  case EA_BASE_R10W:
    uVar8 = 0xec;
    break;
  case EA_BASE_R11W:
    uVar8 = 0xed;
    break;
  case EA_BASE_R12W:
    uVar8 = 0xee;
    break;
  case EA_BASE_R13W:
    uVar8 = 0xef;
    break;
  case EA_BASE_R14W:
    uVar8 = 0xf0;
    break;
  case EA_BASE_R15W:
    uVar8 = 0xf1;
    break;
  case EA_BASE_EAX:
    uVar8 = 0x13;
    break;
  case EA_BASE_ECX:
    uVar8 = 0x16;
    break;
  case EA_BASE_EDX:
    uVar8 = 0x18;
    break;
  case EA_BASE_EBX:
    uVar8 = 0x15;
    break;
  case EA_BASE_sib:
  case EA_BASE_sib64:
    if (0x20 < (ulong)local_180.sibBase) goto switchD_002391c7_caseD_b;
    MCOperand_CreateReg0
              (instr,L" !BCDEFGHIJKLMNOPQ23456789:;<=>?@A)"[(ulong)local_180.sibBase + 0x23]);
    uVar8 = MCInst_getOpcode(instr);
    if (((uVar8 - 0x12e6 < 0x14) && ((0xfc03fU >> (uVar8 - 0x12e6 & 0x1f) & 1) != 0)) ||
       (uVar8 - 0x1aac < 0xc)) {
      iVar7 = 0x71;
      if (((0xe < uVar8 - 0x12ea) || ((0x4801U >> (uVar8 - 0x12ea & 0x1f) & 1) == 0)) &&
         ((9 < uVar8 - 0x1aad || ((0x241U >> (uVar8 - 0x1aad & 0x1f) & 1) == 0)))) {
        iVar7 = (uint)(((uVar8 == 0x1ab2 || uVar8 == 0x1aac) || (uVar8 == 0x1ab0 || uVar8 == 0x1ab5)
                       ) || ((uVar8 == 0x12f4 || uVar8 == 0x12e9) || (uVar8 & 0xffffffef) == 0x12e7)
                      ) * 0x20 + 0x31;
      }
      iVar10 = 4;
      if (local_180.sibIndex != SIB_INDEX_NONE) {
        iVar10 = (uint)(local_180.addressSize != '\b') * 0x10 + local_180.sibIndex + -0x21;
      }
      local_180.sibIndex = iVar10 + iVar7;
    }
    if (local_180.sibIndex == SIB_INDEX_NONE) {
      uVar8 = 0;
    }
    else {
      if (0x7f < local_180.sibIndex - SIB_INDEX_EAX) goto switchD_002391c7_caseD_b;
      uVar8 = *(uint *)(&DAT_004152d8 + (ulong)(local_180.sibIndex - SIB_INDEX_EAX) * 4);
    }
    uVar17 = (ulong)local_180.sibScale;
    goto LAB_0023996f;
  case EA_BASE_EBP:
    uVar8 = 0x14;
    break;
  case EA_BASE_ESI:
    uVar8 = 0x1d;
    break;
  case EA_BASE_EDI:
    uVar8 = 0x17;
    break;
  case EA_BASE_R8D:
    uVar8 = 0xe2;
    break;
  case EA_BASE_R9D:
    uVar8 = 0xe3;
    break;
  case EA_BASE_R10D:
    uVar8 = 0xe4;
    break;
  case EA_BASE_R11D:
    uVar8 = 0xe5;
    break;
  case EA_BASE_R12D:
    uVar8 = 0xe6;
    break;
  case EA_BASE_R13D:
    uVar8 = 0xe7;
    break;
  case EA_BASE_R14D:
    uVar8 = 0xe8;
    break;
  case EA_BASE_R15D:
    uVar8 = 0xe9;
    break;
  case EA_BASE_RAX:
    uVar8 = 0x23;
    break;
  case EA_BASE_RCX:
    uVar8 = 0x26;
    break;
  case EA_BASE_RDX:
    uVar8 = 0x28;
    break;
  case EA_BASE_RBX:
    uVar8 = 0x25;
    break;
  case EA_BASE_RBP:
    uVar8 = 0x24;
    break;
  case EA_BASE_RSI:
    uVar8 = 0x2b;
    break;
  case EA_BASE_RDI:
    uVar8 = 0x27;
    break;
  case EA_BASE_R8:
    uVar8 = 0x6a;
    break;
  case EA_BASE_R9:
    uVar8 = 0x6b;
    break;
  case EA_BASE_R10:
    uVar8 = 0x6c;
    break;
  case EA_BASE_R11:
    uVar8 = 0x6d;
    break;
  case EA_BASE_R12:
    uVar8 = 0x6e;
    break;
  case EA_BASE_R13:
    uVar8 = 0x6f;
    break;
  case EA_BASE_R14:
    uVar8 = 0x70;
    break;
  case EA_BASE_R15:
    uVar8 = 0x71;
    break;
  default:
    goto switchD_002391c7_caseD_b;
  }
  MCOperand_CreateReg0(instr,uVar8);
  uVar17 = 1;
  uVar8 = 0;
LAB_0023996f:
  MCOperand_CreateImm0(instr,uVar17);
  MCOperand_CreateReg0(instr,uVar8);
  MCOperand_CreateImm0(instr,local_180.displacement);
LAB_00239991:
  uVar8 = (uint)""[local_180.segmentOverride];
  goto LAB_002399a6;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn = {0};
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	if (instr->flat_insn->detail) {
		// instr->flat_insn->detail initialization: 3 alternatives

		// 1. The whole structure, this is how it's done in other arch disassemblers
		// Probably overkill since cs_detail is huge because of the 36 operands of ARM
		
		//memset(instr->flat_insn->detail, 0, sizeof(cs_detail));

		// 2. Only the part relevant to x86
		memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86) + sizeof(cs_x86));

		// 3. The relevant part except for x86.operands
		// sizeof(cs_x86) is 0x1c0, sizeof(x86.operands) is 0x180
		// marginally faster, should be okay since x86.op_count is set to 0

		//memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86)+offsetof(cs_x86, operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);
		// handle some special cases here.
		// FIXME: fix this in the next major update.
		switch(*size) {
			default:
				break;
			case 2: {
						unsigned char b1 = 0, b2 = 0;

						reader(&info, &b1, address);
						reader(&info, &b2, address + 1);
						if (b1 == 0x0f && b2 == 0xff) {
							instr->Opcode = X86_UD0;
							instr->OpcodePub = X86_INS_UD0;
							strncpy(instr->assembly, "ud0", 4);
							if (instr->flat_insn->detail) {
								instr->flat_insn->detail->x86.opcode[0] = b1;
								instr->flat_insn->detail->x86.opcode[1] = b2;
							}
							return true;
						}
				}
				return false;
			case 4: {
						if (handle->mode != CS_MODE_16) {
							unsigned char b1 = 0, b2 = 0, b3 = 0, b4 = 0;

							reader(&info, &b1, address);
							reader(&info, &b2, address + 1);
							reader(&info, &b3, address + 2);
							reader(&info, &b4, address + 3);

							if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfa) {
								instr->Opcode = X86_ENDBR64;
								instr->OpcodePub = X86_INS_ENDBR64;
								strncpy(instr->assembly, "endbr64", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							} else if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfb) {
								instr->Opcode = X86_ENDBR32;
								instr->OpcodePub = X86_INS_ENDBR32;
								strncpy(instr->assembly, "endbr32", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							}
						}
				}
				return false;
		}

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			// quick fix for #904. TODO: fix this properly in the next update
			if (handle->mode & CS_MODE_64) {
				if (instr->Opcode == X86_LES16rm || instr->Opcode == X86_LES32rm)
					// LES is invalid in x64
					return false;
				if (instr->Opcode == X86_LDS16rm || instr->Opcode == X86_LDS32rm)
					// LDS is invalid in x64
					return false;
			}

			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}